

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChNodeSPH::ChNodeSPH(ChNodeSPH *this,ChNodeSPH *other)

{
  double dVar1;
  ChCollisionModel *pCVar2;
  ChCollisionModelBullet *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x108);
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)&PTR__ChLoadable_00b2c638;
  ChNodeXYZ::ChNodeXYZ
            (&this->super_ChNodeXYZ,&PTR_construction_vtable_128__00b37538,&other->super_ChNodeXYZ);
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  (this->super_ChNodeXYZ).super_ChLoadableUVW = (ChLoadableUVW)0xb371a8;
  *(undefined8 *)&this->field_0x108 = 0xb37478;
  *(undefined8 *)&(this->super_ChNodeXYZ).field_0x50 = 0xb372f8;
  *(undefined8 *)&this->field_0x68 = 0xb373a0;
  ChVariablesNode::ChVariablesNode(&this->variables);
  (this->UserForce).m_data[0] = 0.0;
  (this->UserForce).m_data[1] = 0.0;
  (this->UserForce).m_data[2] = 0.0;
  this_00 = (ChCollisionModelBullet *)::operator_new(0x68);
  collision::ChCollisionModelBullet::ChCollisionModelBullet(this_00);
  this->collision_model = (ChCollisionModel *)this_00;
  (*(this_00->super_ChCollisionModel)._vptr_ChCollisionModel[0x16])
            (this_00,&(this->super_ChNodeXYZ).field_0x50);
  pCVar2 = this->collision_model;
  local_48 = (other->container->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40 = (other->container->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  (*pCVar2->_vptr_ChCollisionModel[0x13])(other->coll_rad,pCVar2,&local_48);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  this->container = other->container;
  if (other != this) {
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
  }
  dVar1 = other->h_rad;
  this->h_rad = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar1 * 0.5 - this->coll_rad;
  auVar3 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar3);
  collision::ChCollisionModelBullet::SetSphereRadius
            ((ChCollisionModelBullet *)this->collision_model,this->coll_rad,auVar3._0_8_);
  dVar1 = other->coll_rad;
  this->coll_rad = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->h_rad * 0.5 - dVar1;
  auVar3 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar4);
  collision::ChCollisionModelBullet::SetSphereRadius
            ((ChCollisionModelBullet *)this->collision_model,dVar1,auVar3._0_8_);
  (**(code **)((long)(other->super_ChNodeXYZ).super_ChLoadableUVW + 0x90))(other);
  (**(code **)((long)(this->super_ChNodeXYZ).super_ChLoadableUVW + 0x98))(this);
  this->volume = other->volume;
  this->density = other->density;
  this->pressure = other->pressure;
  ChVariablesNode::operator=(&this->variables,&other->variables);
  return;
}

Assistant:

ChNodeSPH::ChNodeSPH(const ChNodeSPH& other) : ChNodeXYZ(other) {
    collision_model = new ChCollisionModelBullet;
    collision_model->SetContactable(this);
    collision_model->AddPoint(other.container->GetMaterialSurface(), other.coll_rad);
    container = other.container;
    UserForce = other.UserForce;
    SetKernelRadius(other.h_rad);
    SetCollisionRadius(other.coll_rad);
    SetMass(other.GetMass());
    volume = other.volume;
    density = other.density;
    pressure = other.pressure;

    variables = other.variables;
}